

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O2

int main(void)

{
  convertMe();
  return 0;
}

Assistant:

int main()
{
    try
    {
        convertMe();
    }
    catch(int i)
    {
        std::cout << "Ups: " << i << std::endl;
    }
    catch(double d)
    {
        std::cout << "Ups: " << d << std::endl;
    }
    return 0;
}